

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_decay(tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread,_Bool all)

{
  byte bVar1;
  _Bool _Var2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  tsdn_t *in_RSI;
  undefined6 in_stack_ffffffffffffffe8;
  
  bVar3 = in_DL & 1;
  bVar1 = in_CL & 1;
  _Var2 = arena_decay_dirty(in_RSI,(arena_t *)
                                   (CONCAT17(in_DL,CONCAT16(in_CL,in_stack_ffffffffffffffe8)) &
                                   0x101ffffffffffff),false,false);
  if (!_Var2) {
    arena_decay_muzzy(in_RSI,(arena_t *)CONCAT17(bVar3,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
                      false,false);
  }
  return;
}

Assistant:

void
arena_decay(tsdn_t *tsdn, arena_t *arena, bool is_background_thread, bool all) {
	if (arena_decay_dirty(tsdn, arena, is_background_thread, all)) {
		return;
	}
	arena_decay_muzzy(tsdn, arena, is_background_thread, all);
}